

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenMetadataTest_ExcessDataProof_Test>::
CreateTest(ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenMetadataTest_ExcessDataProof_Test>
           *this)

{
  TrustTokenMetadataTest *this_00;
  
  WithParamInterface<std::tuple<trust_token_method_st_const*,bool,int,bool>>::parameter_ =
       &this->parameter_;
  this_00 = (TrustTokenMetadataTest *)operator_new(0x58);
  bssl::anon_unknown_0::TrustTokenMetadataTest::TrustTokenMetadataTest(this_00);
  (this_00->super_TrustTokenProtocolTestBase).super_Test._vptr_Test =
       (_func_int **)&PTR__TrustTokenMetadataTest_0068f968;
  (this_00->super_WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>).
  _vptr_WithParamInterface =
       (_func_int **)&PTR__TrustTokenMetadataTest_ExcessDataProof_Test_0068f9a8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }